

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

void __thiscall Clasp::ClaspFacade::SolveStrategy::doNotify(SolveStrategy *this,Event event)

{
  __atomic_base<unsigned_int> *this_00;
  uint in_ESI;
  undefined8 in_RDI;
  uint in_stack_00000088;
  uint in_stack_0000008c;
  atomic<unsigned_int> *in_stack_00000090;
  __int_type __i;
  
  this_00 = (__atomic_base<unsigned_int> *)(ulong)in_ESI;
  __i = (__int_type)((ulong)in_RDI >> 0x20);
  switch(this_00) {
  case (__atomic_base<unsigned_int> *)0x0:
    std::__atomic_base<unsigned_int>::operator=(this_00,__i);
    break;
  case (__atomic_base<unsigned_int> *)0x1:
    std::__atomic_base<unsigned_int>::operator=(this_00,__i);
    break;
  case (__atomic_base<unsigned_int> *)0x2:
    compare_and_swap<unsigned_int>(in_stack_00000090,in_stack_0000008c,in_stack_00000088);
    break;
  case (__atomic_base<unsigned_int> *)0x3:
    std::__atomic_base<unsigned_int>::operator=(this_00,__i);
  }
  return;
}

Assistant:

virtual void doNotify(Event event) {
		switch (event) {
			case event_attach: state_ = state_run;   break;
			case event_model : state_ = state_model; break;
			case event_resume: compare_and_swap(state_, uint32(state_model), uint32(state_run)); break;
			case event_detach: state_ = state_done; break;
		};
	}